

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O2

int __thiscall spdlog::details::file_helper::open(file_helper *this,char *__file,int __oflag,...)

{
  filename_t *__args;
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  int *piVar3;
  int tries;
  int iVar4;
  FILE *tmp;
  filename_t local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  close(this,(int)__file);
  __args = &this->filename_;
  std::__cxx11::string::_M_assign((string *)__args);
  if ((this->event_handlers_).before_open.super__Function_base._M_manager != (_Manager_type)0x0) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(&(this->event_handlers_).before_open,__args);
  }
  iVar4 = 0;
  do {
    if (this->open_tries_ <= iVar4) {
      os::filename_to_str(&local_50,__args);
      std::operator+(&local_70,"Failed opening file ",&local_50);
      std::operator+(&local_90,&local_70," for writing");
      piVar3 = __errno_location();
      throw_spdlog_ex(&local_90,*piVar3);
    }
    os::dir_name(&local_90,(filename_t *)__file);
    os::create_dir(&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    if ((char)__oflag == '\0') {
LAB_0015a6ae:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"ab",(allocator<char> *)&local_70);
      bVar1 = os::fopen_s(&this->fd_,(filename_t *)__file,&local_90);
      iVar2 = std::__cxx11::string::~string((string *)&local_90);
      if (!bVar1) {
        if ((this->event_handlers_).after_open.super__Function_base._M_manager != (_Manager_type)0x0
           ) {
          std::
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,__IO_FILE_*)>
          ::operator()(&(this->event_handlers_).after_open,__args,this->fd_);
          iVar2 = extraout_EAX;
        }
        return iVar2;
      }
      os::sleep_for_millis(this->open_interval_);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"wb",(allocator<char> *)&local_50);
      bVar1 = os::fopen_s((FILE **)&local_70,(filename_t *)__file,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      if (!bVar1) {
        fclose((FILE *)local_70._M_dataplus._M_p);
        goto LAB_0015a6ae;
      }
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

SPDLOG_INLINE void file_helper::open(const filename_t &fname, bool truncate)
{
    close();
    filename_ = fname;

    auto *mode = SPDLOG_FILENAME_T("ab");
    auto *trunc_mode = SPDLOG_FILENAME_T("wb");

    if (event_handlers_.before_open)
    {
        event_handlers_.before_open(filename_);
    }
    for (int tries = 0; tries < open_tries_; ++tries)
    {
        // create containing folder if not exists already.
        os::create_dir(os::dir_name(fname));
        if (truncate)
        {
            // Truncate by opening-and-closing a tmp file in "wb" mode, always
            // opening the actual log-we-write-to in "ab" mode, since that
            // interacts more politely with eternal processes that might
            // rotate/truncate the file underneath us.
            std::FILE *tmp;
            if (os::fopen_s(&tmp, fname, trunc_mode))
            {
                continue;
            }
            std::fclose(tmp);
        }
        if (!os::fopen_s(&fd_, fname, mode))
        {
            if (event_handlers_.after_open)
            {
                event_handlers_.after_open(filename_, fd_);
            }
            return;
        }

        details::os::sleep_for_millis(open_interval_);
    }

    throw_spdlog_ex("Failed opening file " + os::filename_to_str(filename_) + " for writing", errno);
}